

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible,
               bool *out_just_closed,bool *out_text_clipped)

{
  undefined8 uVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ImU32 col;
  byte bVar8;
  ImDrawList *draw_list_00;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float clip_max_x;
  ImVec2 label_size;
  ImGuiLastItemData last_item_backup;
  ImVec2 local_d8;
  ImDrawList *local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  char *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined4 uStack_60;
  float local_5c;
  float fStack_58;
  ImVec2 IStack_54;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar4 = GImGui;
  local_d0 = draw_list;
  local_c8 = frame_padding;
  local_90 = label;
  local_b0 = CalcTextSize(label,(char *)0x0,true,-1.0);
  if (out_just_closed != (bool *)0x0) {
    *out_just_closed = false;
  }
  if (out_text_clipped != (bool *)0x0) {
    *out_text_clipped = false;
  }
  fVar11 = (bb->Min).x;
  fVar10 = (bb->Max).x;
  if (1.0 < fVar10 - fVar11) {
    local_c0.x = fVar11 + local_c8.x;
    local_d8.y = (bb->Min).y;
    local_b8.y = (bb->Max).y;
    local_c0.y = local_c8.y + local_d8.y;
    clip_max_x = fVar10 - local_c8.x;
    if (out_text_clipped != (bool *)0x0) {
      *out_text_clipped = clip_max_x < local_c0.x + local_b0.x;
    }
    fVar13 = pIVar4->FontSize;
    fVar12 = (fVar10 - (local_c8.x + local_c8.x)) - fVar13;
    uVar9 = -(uint)(fVar12 <= fVar11);
    local_d8.x = (float)(uVar9 & (uint)fVar11 | ~uVar9 & (uint)fVar12);
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         (fVar12 = (pIVar4->Style).TabMinWidthForCloseButton, uVar9 = -(uint)(fVar12 <= fVar13),
         fVar10 - fVar11 < (float)(~uVar9 & (uint)fVar12 | uVar9 & (uint)fVar13))))) ||
       ((pIVar4->HoveredId != close_button_id && pIVar4->HoveredId != tab_id &&
        (pIVar4->ActiveId != tab_id && pIVar4->ActiveId != close_button_id)))) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    bVar8 = local_d8.x + fVar13 <= (bb->Max).x & (byte)flags;
    local_b8.x = clip_max_x;
    if (bVar3) {
      local_a8 = ZEXT416((uint)fVar13);
      local_88._0_4_ = (pIVar4->LastItemData).ID;
      local_88._4_4_ = (pIVar4->LastItemData).InFlags;
      uStack_80._0_4_ = (pIVar4->LastItemData).StatusFlags;
      uStack_80._4_4_ = (pIVar4->LastItemData).Rect.Min.x;
      local_78 = *(undefined8 *)&(pIVar4->LastItemData).Rect.Min.y;
      uStack_70 = *(undefined8 *)&(pIVar4->LastItemData).Rect.Max.y;
      uStack_68 = *(undefined8 *)&(pIVar4->LastItemData).NavRect.Min.y;
      uVar1 = *(undefined8 *)&(pIVar4->LastItemData).NavRect.Max.y;
      IStack_54 = (pIVar4->LastItemData).DisplayRect.Max;
      fStack_58 = (pIVar4->LastItemData).DisplayRect.Min.y;
      uStack_60 = (undefined4)uVar1;
      local_5c = (float)((ulong)uVar1 >> 0x20);
      PushStyleVar(0xb,&local_c8);
      bVar5 = CloseButton(close_button_id,&local_d8);
      PopStyleVar(1);
      IVar2.y = fStack_58;
      IVar2.x = local_5c;
      (pIVar4->LastItemData).DisplayRect.Min = IVar2;
      (pIVar4->LastItemData).DisplayRect.Max = IStack_54;
      *(undefined8 *)&(pIVar4->LastItemData).NavRect.Min.y = uStack_68;
      *(ulong *)&(pIVar4->LastItemData).NavRect.Max.y = CONCAT44(local_5c,uStack_60);
      *(undefined8 *)&(pIVar4->LastItemData).Rect.Min.y = local_78;
      *(undefined8 *)&(pIVar4->LastItemData).Rect.Max.y = uStack_70;
      (pIVar4->LastItemData).ID = (undefined4)local_88;
      (pIVar4->LastItemData).InFlags = local_88._4_4_;
      (pIVar4->LastItemData).StatusFlags = (undefined4)uStack_80;
      (pIVar4->LastItemData).Rect.Min.x = (float)uStack_80._4_4_;
      if ((flags & 4U) == 0) {
        bVar6 = IsMouseClicked(2,false);
        if (bVar6) {
          bVar5 = true;
        }
      }
      draw_list_00 = local_d0;
      fVar13 = (float)local_a8._0_4_;
      bVar7 = 1;
    }
    else {
      bVar7 = bVar8;
      if (bVar8 == 0) {
        bVar5 = false;
        draw_list_00 = local_d0;
      }
      else {
        fVar11 = (pIVar4->Style).FramePadding.x;
        fVar10 = (pIVar4->Style).FramePadding.y;
        local_48.x = (local_d8.x + fVar13 + fVar11 + fVar11 + local_d8.x) * 0.5;
        local_48.y = (fVar10 + fVar10 + local_d8.y + fVar13 + local_d8.y) * 0.5;
        uStack_40 = 0;
        bVar5 = false;
        local_a8 = ZEXT416((uint)fVar13);
        col = GetColorU32(0,1.0);
        draw_list_00 = local_d0;
        RenderBullet(local_d0,local_48,col);
        fVar13 = (float)local_a8._0_4_;
      }
    }
    fVar11 = clip_max_x;
    if (!bVar3) {
      fVar11 = (bb->Max).x + -1.0;
    }
    if (bVar7 != 0) {
      fVar10 = fVar13 * 0.8;
      if (!bVar3) {
        fVar13 = fVar10;
      }
      if (bVar8 == 0) {
        fVar10 = 0.0;
      }
      fVar11 = clip_max_x - fVar13;
      local_b8.x = local_b8.x - fVar10;
      clip_max_x = fVar11;
    }
    RenderTextEllipsis(draw_list_00,&local_c0,&local_b8,clip_max_x,fVar11,local_90,(char *)0x0,
                       &local_b0);
    if (out_just_closed != (bool *)0x0) {
      *out_just_closed = bVar5;
    }
  }
  return;
}

Assistant:

void ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible, bool* out_just_closed, bool* out_text_clipped)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    if (out_just_closed)
        *out_just_closed = false;
    if (out_text_clipped)
        *out_text_clipped = false;

    if (bb.GetWidth() <= 1.0f)
        return;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Return clipped state ignoring the close button
    if (out_text_clipped)
    {
        *out_text_clipped = (text_ellipsis_clip_bb.Min.x + label_size.x) > text_pixel_clip_bb.Max.x;
        //draw_list->AddCircle(text_ellipsis_clip_bb.Min, 3.0f, *out_text_clipped ? IM_COL32(255, 0, 0, 255) : IM_COL32(0, 255, 0, 255));
    }

    const float button_sz = g.FontSize;
    const ImVec2 button_pos(ImMax(bb.Min.x, bb.Max.x - frame_padding.x * 2.0f - button_sz), bb.Min.y);

    // Close Button & Unsaved Marker
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= ImMax(button_sz, g.Style.TabMinWidthForCloseButton))
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == tab_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    bool unsaved_marker_visible = (flags & ImGuiTabItemFlags_UnsavedDocument) != 0 && (button_pos.x + button_sz <= bb.Max.x);

    if (close_button_visible)
    {
        ImGuiLastItemData last_item_backup = g.LastItemData;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, button_pos))
            close_button_pressed = true;
        PopStyleVar();
        g.LastItemData = last_item_backup;

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;
    }
    else if (unsaved_marker_visible)
    {
        const ImRect bullet_bb(button_pos, button_pos + ImVec2(button_sz, button_sz) + g.Style.FramePadding * 2.0f);
        RenderBullet(draw_list, bullet_bb.GetCenter(), GetColorU32(ImGuiCol_Text));
    }

    // This is all rather complicated
    // (the main idea is that because the close button only appears on hover, we don't want it to alter the ellipsis position)
    // FIXME: if FramePadding is noticeably large, ellipsis_max_x will be wrong here (e.g. #3497), maybe for consistency that parameter of RenderTextEllipsis() shouldn't exist..
    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    if (close_button_visible || unsaved_marker_visible)
    {
        text_pixel_clip_bb.Max.x -= close_button_visible ? (button_sz) : (button_sz * 0.80f);
        text_ellipsis_clip_bb.Max.x -= unsaved_marker_visible ? (button_sz * 0.80f) : 0.0f;
        ellipsis_max_x = text_pixel_clip_bb.Max.x;
    }
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    if (out_just_closed)
        *out_just_closed = close_button_pressed;
}